

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

bool Js::JavascriptRegExp::HasOriginalRegExType(RecyclableObject *instance)

{
  DynamicType *pDVar1;
  JavascriptLibrary *pJVar2;
  DynamicObject *pDVar3;
  DynamicObject *pDVar4;
  
  pDVar1 = (DynamicType *)(instance->type).ptr;
  pJVar2 = ((Type *)((long)&pDVar1->super_Type + 8))->ptr;
  if (pDVar1 == (pJVar2->regexType).ptr) {
    pDVar3 = (pJVar2->super_JavascriptLibraryBase).regexPrototype.ptr;
    pDVar4 = (DynamicObject *)JavascriptOperators::GetPrototype(instance);
    if (pDVar4 == pDVar3) {
      return (DynamicType *)(pDVar3->super_RecyclableObject).type.ptr ==
             (pJVar2->regexPrototypeType).ptr;
    }
  }
  return false;
}

Assistant:

bool JavascriptRegExp::HasOriginalRegExType(RecyclableObject* instance)
    {
        JavascriptLibrary* library = instance->GetLibrary();

        if (instance->GetType() != library->GetRegexType())
        {
            return false;
        }

        DynamicObject* regexPrototype = library->GetRegExpPrototype();
        return JavascriptOperators::GetPrototype(instance) == regexPrototype
            && regexPrototype->GetType() == library->GetRegexPrototypeType();
    }